

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall
cpp_properties::
cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
::cpp_properties_lexer
          (cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
           *this)

{
  pattern_adder *ppVar1;
  adder *paVar2;
  allocator<char> local_17b9;
  string_type local_17b8;
  allocator<char> local_1791;
  string_type local_1790;
  allocator<char> local_1769;
  string_type local_1768;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_1748;
  allocator<char> local_16e1;
  string_type local_16e0;
  allocator<char> local_16b9;
  string_type local_16b8;
  allocator<char> local_1691;
  string_type local_1690;
  allocator<char> local_1669;
  string_type local_1668;
  allocator<char> local_1641;
  string_type local_1640;
  allocator<char> local_1619;
  string_type local_1618;
  allocator<char> local_15f1;
  string_type local_15f0;
  allocator<char> local_15c9;
  string_type local_15c8;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_15a8;
  allocator<char> local_1541;
  string_type local_1540;
  allocator<char> local_1519;
  string_type local_1518;
  allocator<char> local_14f1;
  string_type local_14f0;
  allocator<char> local_14c9;
  string_type local_14c8;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_14a8;
  allocator<char> local_1441;
  string_type local_1440;
  allocator<char> local_1419;
  string_type local_1418;
  allocator<char> local_13f1;
  string_type local_13f0;
  allocator<char> local_13c9;
  string_type local_13c8;
  allocator<char> local_13a1;
  string_type local_13a0;
  allocator<char> local_1379;
  string_type local_1378;
  allocator<char> local_1351;
  string_type local_1350;
  allocator<char> local_1329;
  string_type local_1328;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_1308;
  allocator<char> local_12a1;
  string_type local_12a0;
  allocator<char> local_1279;
  string_type local_1278;
  allocator<char> local_1251;
  string_type local_1250;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_1230;
  allocator<char> local_11c9;
  string_type local_11c8;
  allocator<char> local_11a1;
  string_type local_11a0;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_1180;
  allocator<char> local_1119;
  string_type local_1118;
  allocator<char> local_10f1;
  string_type local_10f0;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_10d0;
  allocator<char> local_1069;
  string_type local_1068;
  allocator<char> local_1041;
  string_type local_1040;
  allocator<char> local_1019;
  string_type local_1018;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_ff8;
  allocator<char> local_f91;
  string_type local_f90;
  allocator<char> local_f69;
  string_type local_f68;
  allocator<char> local_f41;
  string_type local_f40;
  allocator<char> local_f19;
  string_type local_f18;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_ef8;
  allocator<char> local_e91;
  string_type local_e90;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_e70;
  allocator<char> local_e09;
  string_type local_e08;
  allocator<char> local_de1;
  string_type local_de0;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_dc0;
  allocator<char> local_d59;
  string_type local_d58;
  allocator<char> local_d31;
  string_type local_d30;
  allocator<char> local_d09;
  string_type local_d08;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_ce8;
  allocator<char> local_c81;
  string_type local_c80;
  allocator<char> local_c59;
  string_type local_c58;
  allocator<char> local_c31;
  string_type local_c30;
  allocator<char> local_c09;
  string_type local_c08;
  allocator<char> local_be1;
  string_type local_be0;
  allocator<char> local_bb9;
  string_type local_bb8;
  allocator<char> local_b91;
  string_type local_b90;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_b70;
  allocator<char> local_b09;
  string_type local_b08;
  allocator<char> local_ae1;
  string_type local_ae0;
  allocator<char> local_ab9;
  string_type local_ab8;
  allocator<char> local_a91;
  string_type local_a90;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_a70;
  allocator<char> local_a09;
  string_type local_a08;
  allocator<char> local_9e1;
  string_type local_9e0;
  allocator<char> local_9b9;
  string_type local_9b8;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_998;
  allocator<char> local_931;
  string_type local_930;
  allocator<char> local_909;
  string_type local_908;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_8e8;
  allocator<char> local_881;
  string_type local_880;
  allocator<char> local_859;
  string_type local_858;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_838;
  allocator<char> local_7d1;
  string_type local_7d0;
  allocator<char> local_7a9;
  string_type local_7a8;
  allocator<char> local_781;
  string_type local_780;
  allocator<char> local_759;
  string_type local_758;
  allocator<char> local_731;
  string_type local_730;
  allocator<char> local_709;
  string_type local_708;
  allocator<char> local_6e1;
  string_type local_6e0;
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  local_6c0;
  allocator<char> local_659;
  string_type local_658;
  allocator<char> local_631;
  string_type local_630;
  allocator<char> local_609;
  string_type local_608;
  allocator<char> local_5e1;
  string_type local_5e0;
  allocator<char> local_5b9;
  string_type local_5b8;
  allocator<char> local_591;
  string_type local_590;
  allocator<char> local_569;
  string_type local_568;
  allocator<char> local_541;
  string_type local_540;
  allocator<char> local_519;
  string_type local_518;
  allocator<char> local_4f1;
  string_type local_4f0;
  allocator<char> local_4c9;
  string_type local_4c8;
  allocator<char> local_4a1;
  string_type local_4a0;
  allocator<char> local_479;
  string_type local_478;
  allocator<char> local_451;
  string_type local_450;
  allocator<char> local_429;
  string_type local_428;
  allocator<char> local_401;
  string_type local_400;
  allocator<char> local_3d9;
  string_type local_3d8;
  allocator<char> local_3b1;
  string_type local_3b0;
  allocator<char> local_389;
  string_type local_388;
  allocator<char> local_361;
  string_type local_360;
  allocator<char> local_339;
  string_type local_338;
  allocator<char> local_311;
  string_type local_310;
  allocator<char> local_2e9;
  string_type local_2e8;
  allocator<char> local_2c1;
  string_type local_2c0;
  allocator<char> local_299;
  string_type local_298;
  allocator<char> local_271;
  string_type local_270;
  allocator<char> local_249;
  string_type local_248;
  allocator<char> local_221;
  string_type local_220;
  allocator<char> local_1f9;
  string_type local_1f8;
  allocator<char> local_1d1;
  string_type local_1d0;
  allocator<char> local_1a9;
  string_type local_1a8;
  allocator<char> local_181;
  string_type local_180;
  allocator<char> local_159;
  string_type local_158;
  allocator<char> local_131;
  string_type local_130;
  allocator<char> local_109;
  string_type local_108;
  allocator<char> local_e1;
  string_type local_e0;
  allocator<char> local_b9;
  string_type local_b8;
  allocator<char> local_91;
  string_type local_90;
  allocator<char> local_69;
  string_type local_68;
  allocator<char> local_31;
  string_type local_30;
  cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  *local_10;
  cpp_properties_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  *this_local;
  
  local_10 = this;
  boost::spirit::lex::
  lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
  ::lexer(&this->
           super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
          ,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"cr",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\\r",&local_69);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()
                     (&(this->
                       super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                       ).self.add_pattern,&local_30,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"lf",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"\\n",&local_b9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_90,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"eol",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"\\r\\n",&local_109);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_e0,&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"lb_cr",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"\\\\\\r[ \\f\\t]*",&local_159);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_130,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"lb_lf",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"\\\\\\n[ \\f\\t]*",&local_1a9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_180,&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"lb_eol",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"\\\\\\r\\n[ \\f\\t]*",&local_1f9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_1d0,&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"spaces",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"[ \\f\\t]+",&local_249);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_220,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"sharp",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"#",&local_299);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_270,&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"exclamation",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"!",&local_2e9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_2c0,&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"comment",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"[^ \\f\\t\\r\\n]+",&local_339);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_310,&local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"colon",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,":",&local_389);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_360,&local_388);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"equal",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"=",&local_3d9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_3b0,&local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"backslash",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"\\\\",&local_429);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_400,&local_428);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"first_key",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"[^ \\f\\t\\r\\n\\\\=:#!][^ \\f\\t\\r\\n\\\\=:]*",&local_479);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_450,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"key",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"[^ \\f\\t\\r\\n\\\\=:]+",&local_4c9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_4a0,&local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"blank_value",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"[^ \\f\\t\\r\\n\\\\=:][^ \\f\\t\\r\\n\\\\]*",&local_519);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_4f0,&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"value",&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"[^ \\f\\t\\r\\n\\\\]+",&local_569);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_540,&local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"unicode",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"\\\\u[0-9a-fA-F]{4}",&local_5b9);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_590,&local_5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"bad_unicode",&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"\\\\u[0-9a-fA-F]{0,3}",&local_609);
  ppVar1 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::pattern_adder::operator()(ppVar1,&local_5e0,&local_608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"escape",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"\\\\[^\\r\\n]",&local_659);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::pattern_adder::operator()(ppVar1,&local_630,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_6c0,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"INITIAL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"{spaces}",&local_6e1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_6c0.add,&local_6e0,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"{cr}",&local_709);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_708,0x3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"{lf}",&local_731);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_730,0x3ea);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"{eol}",&local_759);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_758,0x3eb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"{lb_cr}",&local_781);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_780,0x3ec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"{lb_lf}",&local_7a9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_7a8,0x3ed);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,"{lb_eol}",&local_7d1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_7d0,0x3ee);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_6c0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_838,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"INITIAL","COMMENT");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"{sharp}",&local_859);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_838.add,&local_858,0x3ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"{exclamation}",&local_881);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_880,0x3f0);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_838);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_8e8,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"COMMENT");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"{comment}",&local_909);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_8e8.add,&local_908,0x3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_930,"{spaces}",&local_931);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_930,0x3f2);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator(&local_931);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator(&local_909);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_8e8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_998,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"COMMENT","INITIAL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"{cr}",&local_9b9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_998.add,&local_9b8,0x3f3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"{lf}",&local_9e1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_9e0,0x3f4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"{eol}",&local_a09);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_a08,0x3f5);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_998);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_a70,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"INITIAL","KEY");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"{first_key}",&local_a91);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_a70.add,&local_a90,0x3f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,"{escape}",&local_ab9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_ab8,0x3f7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"{unicode}",&local_ae1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_ae0,0x3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"{bad_unicode}",&local_b09);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_b08,0x3f9);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_a70);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_b70,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"KEY");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b90,"{key}",&local_b91);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_b70.add,&local_b90,0x3f6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bb8,"{escape}",&local_bb9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_bb8,0x3f7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_be0,"{unicode}",&local_be1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_be0,0x3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c08,"{lb_cr}",&local_c09);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_c08,0x3fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c30,"{lb_lf}",&local_c31);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_c30,0x3fe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c58,"{lb_eol}",&local_c59);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_c58,0x3ff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c80,"{bad_unicode}",&local_c81);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_c80,0x3f9);
  std::__cxx11::string::~string((string *)&local_c80);
  std::allocator<char>::~allocator(&local_c81);
  std::__cxx11::string::~string((string *)&local_c58);
  std::allocator<char>::~allocator(&local_c59);
  std::__cxx11::string::~string((string *)&local_c30);
  std::allocator<char>::~allocator(&local_c31);
  std::__cxx11::string::~string((string *)&local_c08);
  std::allocator<char>::~allocator(&local_c09);
  std::__cxx11::string::~string((string *)&local_be0);
  std::allocator<char>::~allocator(&local_be1);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator(&local_bb9);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_b70);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_ce8,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"KEY","INITIAL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"{cr}",&local_d09);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_ce8.add,&local_d08,0x3fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d30,"{lf}",&local_d31);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_d30,0x3fb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d58,"{eol}",&local_d59);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_d58,0x3fc);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator(&local_d59);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator(&local_d31);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_ce8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_dc0,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"KEY","SEPARATOR");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_de0,"{colon}",&local_de1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_dc0.add,&local_de0,0x400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e08,"{equal}",&local_e09);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_e08,0x401);
  std::__cxx11::string::~string((string *)&local_e08);
  std::allocator<char>::~allocator(&local_e09);
  std::__cxx11::string::~string((string *)&local_de0);
  std::allocator<char>::~allocator(&local_de1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_dc0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_e70,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"KEY","BLANK_SEPARATOR");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e90,"{spaces}",&local_e91);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(&local_e70.add,&local_e90,0x402);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator(&local_e91);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_e70);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_ef8,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"BLANK_SEPARATOR");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f18,"{lb_cr}",&local_f19);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_ef8.add,&local_f18,0x406);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f40,"{lb_lf}",&local_f41);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_f40,0x407);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f68,"{lb_eol}",&local_f69);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_f68,0x408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f90,"{spaces}",&local_f91);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_f90,0x402);
  std::__cxx11::string::~string((string *)&local_f90);
  std::allocator<char>::~allocator(&local_f91);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator(&local_f69);
  std::__cxx11::string::~string((string *)&local_f40);
  std::allocator<char>::~allocator(&local_f41);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator(&local_f19);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_ef8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_ff8,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"BLANK_SEPARATOR","INITIAL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1018,"{cr}",&local_1019);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_ff8.add,&local_1018,0x403);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1040,"{lf}",&local_1041);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1040,0x404);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1068,"{eol}",&local_1069);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_1068,0x405);
  std::__cxx11::string::~string((string *)&local_1068);
  std::allocator<char>::~allocator(&local_1069);
  std::__cxx11::string::~string((string *)&local_1040);
  std::allocator<char>::~allocator(&local_1041);
  std::__cxx11::string::~string((string *)&local_1018);
  std::allocator<char>::~allocator(&local_1019);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_ff8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_10d0,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"BLANK_SEPARATOR","SEPARATOR");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f0,"{colon}",&local_10f1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_10d0.add,&local_10f0,0x400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1118,"{equal}",&local_1119);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_1118,0x401);
  std::__cxx11::string::~string((string *)&local_1118);
  std::allocator<char>::~allocator(&local_1119);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::allocator<char>::~allocator(&local_10f1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_10d0);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_1180,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"INITIAL","SEPARATOR");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a0,"{colon}",&local_11a1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_1180.add,&local_11a0,0x400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11c8,"{equal}",&local_11c9);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_11c8,0x401);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::allocator<char>::~allocator(&local_11c9);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::allocator<char>::~allocator(&local_11a1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_1180);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_1230,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"SEPARATOR","INITIAL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,"{cr}",&local_1251);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_1230.add,&local_1250,0x403);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1278,"{lf}",&local_1279);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1278,0x404);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12a0,"{eol}",&local_12a1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_12a0,0x405);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator(&local_12a1);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator(&local_1279);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_1230);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_1308,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"SEPARATOR","VALUE");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1328,"{spaces}",&local_1329);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_1308.add,&local_1328,0x409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1350,"{value}",&local_1351);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1350,0x40a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1378,"{escape}",&local_1379);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1378,0x40b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13a0,"{unicode}",&local_13a1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_13a0,0x40c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13c8,"{lb_cr}",&local_13c9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_13c8,0x411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13f0,"{lb_lf}",&local_13f1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_13f0,0x412);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1418,"{lb_eol}",&local_1419);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1418,0x413);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1440,"{bad_unicode}",&local_1441);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_1440,0x40d);
  std::__cxx11::string::~string((string *)&local_1440);
  std::allocator<char>::~allocator(&local_1441);
  std::__cxx11::string::~string((string *)&local_1418);
  std::allocator<char>::~allocator(&local_1419);
  std::__cxx11::string::~string((string *)&local_13f0);
  std::allocator<char>::~allocator(&local_13f1);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator(&local_13c9);
  std::__cxx11::string::~string((string *)&local_13a0);
  std::allocator<char>::~allocator(&local_13a1);
  std::__cxx11::string::~string((string *)&local_1378);
  std::allocator<char>::~allocator(&local_1379);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator(&local_1351);
  std::__cxx11::string::~string((string *)&local_1328);
  std::allocator<char>::~allocator(&local_1329);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_1308);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_14a8,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"BLANK_SEPARATOR","VALUE");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"{blank_value}",&local_14c9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_14a8.add,&local_14c8,0x40a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14f0,"{escape}",&local_14f1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_14f0,0x40b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1518,"{unicode}",&local_1519);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1518,0x40c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1540,"{bad_unicode}",&local_1541);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_1540,0x40d);
  std::__cxx11::string::~string((string *)&local_1540);
  std::allocator<char>::~allocator(&local_1541);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator(&local_1519);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::allocator<char>::~allocator(&local_14f1);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::allocator<char>::~allocator(&local_14c9);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_14a8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_15a8,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"VALUE");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15c8,"{spaces}",&local_15c9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_15a8.add,&local_15c8,0x409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_15f0,"{value}",&local_15f1);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_15f0,0x40a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1618,"{escape}",&local_1619);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1618,0x40b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1640,"{unicode}",&local_1641);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1640,0x40c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1668,"{lb_cr}",&local_1669);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1668,0x411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1690,"{lb_lf}",&local_1691);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1690,0x412);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16b8,"{lb_eol}",&local_16b9);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_16b8,0x413);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16e0,"{bad_unicode}",&local_16e1);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_16e0,0x40d);
  std::__cxx11::string::~string((string *)&local_16e0);
  std::allocator<char>::~allocator(&local_16e1);
  std::__cxx11::string::~string((string *)&local_16b8);
  std::allocator<char>::~allocator(&local_16b9);
  std::__cxx11::string::~string((string *)&local_1690);
  std::allocator<char>::~allocator(&local_1691);
  std::__cxx11::string::~string((string *)&local_1668);
  std::allocator<char>::~allocator(&local_1669);
  std::__cxx11::string::~string((string *)&local_1640);
  std::allocator<char>::~allocator(&local_1641);
  std::__cxx11::string::~string((string *)&local_1618);
  std::allocator<char>::~allocator(&local_1619);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::allocator<char>::~allocator(&local_15f1);
  std::__cxx11::string::~string((string *)&local_15c8);
  std::allocator<char>::~allocator(&local_15c9);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_15a8);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::operator()(&local_1748,
               &(this->
                super_lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>
                ).self,"VALUE","INITIAL");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1768,"{cr}",&local_1769);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(&local_1748.add,&local_1768,0x40e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1790,"{lf}",&local_1791);
  paVar2 = boost::spirit::lex::detail::
           lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
           ::adder::operator()(paVar2,&local_1790,0x40f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17b8,"{eol}",&local_17b9);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::adder::operator()(paVar2,&local_17b8,0x410);
  std::__cxx11::string::~string((string *)&local_17b8);
  std::allocator<char>::~allocator(&local_17b9);
  std::__cxx11::string::~string((string *)&local_1790);
  std::allocator<char>::~allocator(&local_1791);
  std::__cxx11::string::~string((string *)&local_1768);
  std::allocator<char>::~allocator(&local_1769);
  boost::spirit::lex::detail::
  lexer_def_<boost::spirit::lex::lexer<boost::spirit::lex::lexertl::lexer<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_const_char_*,_boost::spirit::lex::lexertl::functor<boost::spirit::lex::lexertl::token<const_char_*,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>,_boost::spirit::lex::lexertl::detail::data,_const_char_*,_mpl_::bool_<false>,_mpl_::bool_<true>_>_>_>_>
  ::~lexer_def_(&local_1748);
  return;
}

Assistant:

cpp_properties_lexer()
    {
        using namespace token;
        this->self.add_pattern
            ("cr"          , "\\r")
            ("lf"          , "\\n")
            ("eol"         , "\\r\\n")

            ("lb_cr"       , "\\\\\\r[ \\f\\t]*")
            ("lb_lf"       , "\\\\\\n[ \\f\\t]*")
            ("lb_eol"      , "\\\\\\r\\n[ \\f\\t]*")

            ("spaces"      , "[ \\f\\t]+")

            ("sharp"       , "#")
            ("exclamation" , "!")
            ("comment"     , "[^ \\f\\t\\r\\n]+")

            ("colon"       , ":")
            ("equal"       , "=")

            ("backslash"   , "\\\\")
            ("first_key"   , "[^ \\f\\t\\r\\n\\\\=:#!][^ \\f\\t\\r\\n\\\\=:]*")
            ("key"         , "[^ \\f\\t\\r\\n\\\\=:]+")

            ("blank_value" , "[^ \\f\\t\\r\\n\\\\=:][^ \\f\\t\\r\\n\\\\]*")
            ("value"       , "[^ \\f\\t\\r\\n\\\\]+")

            ("unicode"     , "\\\\u[0-9a-fA-F]{4}")
            ("bad_unicode" , "\\\\u[0-9a-fA-F]{0,3}")
            ("escape"      , "\\\\[^\\r\\n]")
        ;

        this->self("INITIAL").add
            ("{spaces}"      , ID_SPACES)
            ("{cr}"          , ID_CR)
            ("{lf}"          , ID_LF)
            ("{eol}"         , ID_EOL)
            ("{lb_cr}"       , ID_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_LINE_BREAK_EOL)
        ;

        this->self("INITIAL", "COMMENT").add
            ("{sharp}"       , ID_COMMENT_SHARP)
            ("{exclamation}" , ID_COMMENT_EXCLAMATION)
        ;

        this->self("COMMENT").add
            ("{comment}"     , ID_COMMENT_CHARS)
            ("{spaces}"      , ID_COMMENT_SPACES)
        ;

        this->self("COMMENT", "INITIAL").add
            ("{cr}"          , ID_COMMENT_CR)
            ("{lf}"          , ID_COMMENT_LF)
            ("{eol}"         , ID_COMMENT_EOL)
        ;

        this->self("INITIAL", "KEY").add
            ("{first_key}"   , ID_KEY_CHARS)
            ("{escape}"      , ID_KEY_ESCAPE_CHAR)
            ("{unicode}"     , ID_KEY_UNICODE)
            ("{bad_unicode}" , ID_KEY_BAD_UNICODE)
        ;

        this->self("KEY").add
            ("{key}"         , ID_KEY_CHARS)
            ("{escape}"      , ID_KEY_ESCAPE_CHAR)
            ("{unicode}"     , ID_KEY_UNICODE)
            ("{lb_cr}"       , ID_KEY_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_KEY_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_KEY_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_KEY_BAD_UNICODE)
        ;

        this->self("KEY", "INITIAL").add
            ("{cr}"          , ID_KEY_CR)
            ("{lf}"          , ID_KEY_LF)
            ("{eol}"         , ID_KEY_EOL)
        ;

        this->self("KEY", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("KEY", "BLANK_SEPARATOR").add
            ("{spaces}"      , ID_SEPARATOR_SPACES)
        ;

        this->self("BLANK_SEPARATOR").add
            ("{lb_cr}"       , ID_SEPARATOR_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_SEPARATOR_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_SEPARATOR_LINE_BREAK_EOL)
            ("{spaces}"      , ID_SEPARATOR_SPACES)
        ;

        this->self("BLANK_SEPARATOR", "INITIAL").add
            ("{cr}"          , ID_SEPARATOR_CR)
            ("{lf}"          , ID_SEPARATOR_LF)
            ("{eol}"         , ID_SEPARATOR_EOL)
        ;

        this->self("BLANK_SEPARATOR", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("INITIAL", "SEPARATOR").add
            ("{colon}"       , ID_SEPARATOR_COLON)
            ("{equal}"       , ID_SEPARATOR_EQUAL)
        ;

        this->self("SEPARATOR", "INITIAL").add
            ("{cr}"          , ID_SEPARATOR_CR)
            ("{lf}"          , ID_SEPARATOR_LF)
            ("{eol}"         , ID_SEPARATOR_EOL)
        ;

        this->self("SEPARATOR", "VALUE").add
            ("{spaces}"      , ID_VALUE_SPACES)
            ("{value}"       , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{lb_cr}"       , ID_VALUE_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_VALUE_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_VALUE_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("BLANK_SEPARATOR", "VALUE").add
            ("{blank_value}" , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("VALUE").add
            ("{spaces}"      , ID_VALUE_SPACES)
            ("{value}"       , ID_VALUE_CHARS)
            ("{escape}"      , ID_VALUE_ESCAPE_CHAR)
            ("{unicode}"     , ID_VALUE_UNICODE)
            ("{lb_cr}"       , ID_VALUE_LINE_BREAK_CR)
            ("{lb_lf}"       , ID_VALUE_LINE_BREAK_LF)
            ("{lb_eol}"      , ID_VALUE_LINE_BREAK_EOL)
            ("{bad_unicode}" , ID_VALUE_BAD_UNICODE)
        ;

        this->self("VALUE", "INITIAL").add
            ("{cr}"          , ID_VALUE_CR)
            ("{lf}"          , ID_VALUE_LF)
            ("{eol}"         , ID_VALUE_EOL)
        ;

    }